

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_26fab4::CpuZeropageIndexedTest_isb_zero_x_Test::
~CpuZeropageIndexedTest_isb_zero_x_Test(CpuZeropageIndexedTest_isb_zero_x_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest((CpuTest *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuZeropageIndexedTest, isb_zero_x) {
    registers.a = 0x50;
    registers.p = V_FLAG | C_FLAG;
    expected.p = C_FLAG;
    expected.a = 0x50 - 0x07;
    memory_content = 0x07 - 0x01;

    run_readwrite_instruction(ISB_ZEROX, IndexReg::X, 0x07);
}